

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

Bbr2Mode __thiscall
quic::Bbr2ProbeBwMode::OnCongestionEvent
          (Bbr2ProbeBwMode *this,QuicByteCount prior_in_flight,QuicTime event_time,
          AckedPacketVector *param_3,LostPacketVector *param_4,Bbr2CongestionEvent *congestion_event
          )

{
  Bbr2NetworkModel *pBVar1;
  bool bVar2;
  bool bVar3;
  Bbr2Params *pBVar4;
  float pacing_gain;
  Bbr2Mode local_79;
  bool switch_to_probe_rtt;
  Bbr2CongestionEvent *congestion_event_local;
  LostPacketVector *param_4_local;
  AckedPacketVector *param_3_local;
  QuicByteCount prior_in_flight_local;
  Bbr2ProbeBwMode *this_local;
  QuicTime event_time_local;
  
  if ((congestion_event->end_of_round_trip & 1U) != 0) {
    bVar2 = operator!=((QuicTime)(this->cycle_).cycle_start_time.time_,event_time);
    if (bVar2) {
      (this->cycle_).rounds_since_probe = (this->cycle_).rounds_since_probe + 1;
    }
    bVar2 = operator!=((QuicTime)(this->cycle_).phase_start_time.time_,event_time);
    if (bVar2) {
      (this->cycle_).rounds_in_phase = (this->cycle_).rounds_in_phase + 1;
    }
  }
  bVar2 = false;
  if ((this->cycle_).phase == PROBE_UP) {
    UpdateProbeUp(this,prior_in_flight,congestion_event);
  }
  else if ((this->cycle_).phase == PROBE_DOWN) {
    UpdateProbeDown(this,prior_in_flight,congestion_event);
    if (((this->cycle_).phase != PROBE_DOWN) &&
       (bVar3 = Bbr2NetworkModel::MaybeExpireMinRtt
                          ((this->super_Bbr2ModeBase).model_,congestion_event), bVar3)) {
      bVar2 = true;
    }
  }
  else if ((this->cycle_).phase == PROBE_CRUISE) {
    UpdateProbeCruise(this,congestion_event);
  }
  else if ((this->cycle_).phase == PROBE_REFILL) {
    UpdateProbeRefill(this,congestion_event);
  }
  if (!bVar2) {
    pBVar1 = (this->super_Bbr2ModeBase).model_;
    pacing_gain = PacingGainForPhase(this,(this->cycle_).phase);
    Bbr2NetworkModel::set_pacing_gain(pBVar1,pacing_gain);
    pBVar1 = (this->super_Bbr2ModeBase).model_;
    pBVar4 = Params(this);
    Bbr2NetworkModel::set_cwnd_gain(pBVar1,pBVar4->probe_bw_cwnd_gain);
  }
  local_79 = PROBE_RTT;
  if (!bVar2) {
    local_79 = PROBE_BW;
  }
  return local_79;
}

Assistant:

Bbr2Mode Bbr2ProbeBwMode::OnCongestionEvent(
    QuicByteCount prior_in_flight,
    QuicTime event_time,
    const AckedPacketVector& /*acked_packets*/,
    const LostPacketVector& /*lost_packets*/,
    const Bbr2CongestionEvent& congestion_event) {
  //DCHECK_NE(cycle_.phase, CyclePhase::PROBE_NOT_STARTED);

  if (congestion_event.end_of_round_trip) {
    if (cycle_.cycle_start_time != event_time) {
      ++cycle_.rounds_since_probe;
    }
    if (cycle_.phase_start_time != event_time) {
      ++cycle_.rounds_in_phase;
    }
  }

  bool switch_to_probe_rtt = false;

  if (cycle_.phase == CyclePhase::PROBE_UP) {
    UpdateProbeUp(prior_in_flight, congestion_event);
  } else if (cycle_.phase == CyclePhase::PROBE_DOWN) {
    UpdateProbeDown(prior_in_flight, congestion_event);
    // Maybe transition to PROBE_RTT at the end of this cycle.
    if (cycle_.phase != CyclePhase::PROBE_DOWN &&
        model_->MaybeExpireMinRtt(congestion_event)) {
      switch_to_probe_rtt = true;
    }
  } else if (cycle_.phase == CyclePhase::PROBE_CRUISE) {
    UpdateProbeCruise(congestion_event);
  } else if (cycle_.phase == CyclePhase::PROBE_REFILL) {
    UpdateProbeRefill(congestion_event);
  }

  // Do not need to set the gains if switching to PROBE_RTT, they will be set
  // when Bbr2ProbeRttMode::Enter is called.
  if (!switch_to_probe_rtt) {
    model_->set_pacing_gain(PacingGainForPhase(cycle_.phase));
    model_->set_cwnd_gain(Params().probe_bw_cwnd_gain);
  }

  return switch_to_probe_rtt ? Bbr2Mode::PROBE_RTT : Bbr2Mode::PROBE_BW;
}